

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoxProjection.cpp
# Opt level: O3

double __thiscall BoxProjection::coordinateZ(BoxProjection *this,int J,int K,int L,int G)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  switch(G) {
  case 0:
    dVar3 = (this->super_Parameterization).x_lb + (this->super_Parameterization).dx * (double)J;
    dVar6 = (this->super_Parameterization).y_lb + (this->super_Parameterization).dy * (double)K;
    auVar2._8_4_ = SUB84(dVar6,0);
    auVar2._0_8_ = dVar3;
    auVar2._12_4_ = (int)((ulong)dVar6 >> 0x20);
    (this->super_Parameterization).x = dVar3;
    (this->super_Parameterization).y = (double)auVar2._8_8_;
    dVar7 = (this->super_Parameterization).z_lb;
    goto LAB_00104a16;
  case 1:
    dVar6 = (this->super_Parameterization).y_lb;
    dVar3 = (this->super_Parameterization).x_ub - (double)J * (this->super_Parameterization).dx;
    (this->super_Parameterization).x = dVar3;
    (this->super_Parameterization).y = dVar6;
    dVar7 = (double)K * (this->super_Parameterization).dz + (this->super_Parameterization).z_lb;
    (this->super_Parameterization).z = dVar7;
    break;
  case 2:
    dVar6 = (this->super_Parameterization).x_lb;
    uVar4 = SUB84(dVar6,0);
    uVar5 = (undefined4)((ulong)dVar6 >> 0x20);
    (this->super_Parameterization).x = dVar6;
    dVar6 = (this->super_Parameterization).y_lb;
    dVar8 = (this->super_Parameterization).dy * (double)J;
    dVar9 = (this->super_Parameterization).dz * (double)K;
    dVar7 = (this->super_Parameterization).z_lb;
    goto LAB_00104a95;
  case 3:
    dVar3 = (this->super_Parameterization).dx * -(double)J + (this->super_Parameterization).x_ub;
    dVar6 = (this->super_Parameterization).dy * (double)K + (this->super_Parameterization).y_lb;
    auVar1._8_4_ = SUB84(dVar6,0);
    auVar1._0_8_ = dVar3;
    auVar1._12_4_ = (int)((ulong)dVar6 >> 0x20);
    (this->super_Parameterization).x = dVar3;
    (this->super_Parameterization).y = (double)auVar1._8_8_;
    dVar7 = (this->super_Parameterization).z_ub;
LAB_00104a16:
    (this->super_Parameterization).z = dVar7;
    break;
  case 4:
    dVar3 = (double)J * (this->super_Parameterization).dx + (this->super_Parameterization).x_lb;
    (this->super_Parameterization).x = dVar3;
    dVar6 = (this->super_Parameterization).y_ub;
    (this->super_Parameterization).y = dVar6;
    dVar7 = (double)K * (this->super_Parameterization).dz + (this->super_Parameterization).z_lb;
    (this->super_Parameterization).z = dVar7;
    break;
  case 5:
    dVar6 = (this->super_Parameterization).x_ub;
    uVar4 = SUB84(dVar6,0);
    uVar5 = (undefined4)((ulong)dVar6 >> 0x20);
    (this->super_Parameterization).x = dVar6;
    dVar8 = (this->super_Parameterization).y_ub;
    dVar9 = (this->super_Parameterization).z_lb;
    dVar6 = (this->super_Parameterization).dy * -(double)J;
    dVar7 = (this->super_Parameterization).dz * (double)K;
LAB_00104a95:
    dVar3 = (double)CONCAT44(uVar5,uVar4);
    dVar6 = dVar6 + dVar8;
    dVar7 = dVar7 + dVar9;
    (this->super_Parameterization).y = dVar6;
    (this->super_Parameterization).z = dVar7;
    break;
  default:
    dVar7 = (this->super_Parameterization).z;
    dVar3 = (this->super_Parameterization).x;
    dVar6 = (this->super_Parameterization).y;
  }
  return ((this->super_Parameterization).radius /
         SQRT(dVar7 * dVar7 + dVar3 * dVar3 + dVar6 * dVar6)) * dVar7;
}

Assistant:

double BoxProjection::coordinateZ(int J, int K, int L, int G) {
  switch (G) {
    case 0:  // Lower z
      x = x_lb + (double)J * dx;
      y = y_lb + (double)K * dy;
      z = z_lb;
      break;
    case 1:  // Lower y
      x = x_ub - (double)J * dx;
      y = y_lb;
      z = z_lb + (double)K * dz;
      break;
    case 2:  // Lower x
      x = x_lb;
      y = y_lb + (double)J * dy;
      z = z_lb + (double)K * dz;
      break;
    case 3:  // Upper z
      x = x_ub - (double)J * dx;
      y = y_lb + (double)K * dy;
      z = z_ub;
      break;
    case 4:  // Upper y
      x = x_lb + (double)J * dx;
      y = y_ub;
      z = z_lb + (double)K * dz;
      break;
    case 5:  // Upper x
      x = x_ub;
      y = y_ub - (double)J * dy;
      z = z_lb + (double)K * dz;
      break;
  }

  return z * projection(x, y, z);
}